

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

JavascriptString * __thiscall Js::ScriptContext::GetIntegerString(ScriptContext *this,int value)

{
  Type *addr;
  JavascriptLibrary *pJVar1;
  bool bVar2;
  int iVar3;
  JavascriptString *pJVar4;
  Recycler *alloc;
  BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar5;
  undefined1 local_68 [8];
  TrackAllocData data;
  JavascriptString *local_38;
  JavascriptString *string;
  int value_local;
  
  string._4_4_ = value;
  if ((uint)value < 10) {
    pJVar4 = CharStringCache::GetStringForCharA
                       (&((this->super_ScriptContextBase).javascriptLibrary)->charStringCache,
                        (byte)value | 0x30);
    return pJVar4;
  }
  if ((((this->super_ScriptContextBase).javascriptLibrary)->cache).integerStringMap.ptr ==
      (BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    local_68 = (undefined1  [8])
               &JsUtil::
                BaseDictionary<unsigned_int,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d86450;
    data.filename._0_4_ = 0x742;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
    pBVar5 = (BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)new<Memory::Recycler>(0x38,alloc,0x38bbb2);
    JsUtil::
    BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(pBVar5,this->recycler,0);
    pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
    addr = &(pJVar1->cache).integerStringMap;
    Memory::Recycler::WBSetBit((char *)addr);
    (pJVar1->cache).integerStringMap.ptr = pBVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  pBVar5 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).integerStringMap.ptr;
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<int>(pBVar5,(int *)((long)&string + 4),&local_38);
  if (bVar2) {
    if (this->integerStringMapCacheUseCount < 0x30) {
      this->integerStringMapCacheUseCount = this->integerStringMapCacheUseCount + 1;
    }
  }
  else {
    if (0x400 < this->integerStringMapCacheMissCount) {
      this->integerStringMapCacheMissCount = 0;
      if (0x2f < this->integerStringMapCacheUseCount) {
        JsUtil::
        BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Clear(pBVar5);
      }
      this->integerStringMapCacheUseCount = 0;
    }
    if (pBVar5->count - pBVar5->freeCount < 0x401) {
      iVar3 = TaggedInt::ToBuffer(string._4_4_,(char16 *)local_68,0x16);
      local_38 = JavascriptString::NewCopyBuffer
                           ((char16 *)(local_68 + (long)iVar3 * 2),0x15 - iVar3,this);
      data._36_4_ = string._4_4_;
      JsUtil::
      BaseDictionary<unsigned_int,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_int,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)pBVar5,(uint *)&data.field_0x24,&local_38);
    }
    else {
      local_38 = TaggedInt::ToString(string._4_4_,this);
      this->integerStringMapCacheMissCount = this->integerStringMapCacheMissCount + 1;
    }
  }
  return local_38;
}

Assistant:

JavascriptString* ScriptContext::GetIntegerString(int value)
    {
        // Optimize for 0-9
        if (0 <= value && value <= 9)
        {
            return GetLibrary()->GetCharStringCache().GetStringForCharA('0' + static_cast<char>(value));
        }

        JavascriptString *string;

// TODO: (obastemur) Could this be dynamic instead of compile time?
#ifndef CC_LOW_MEMORY_TARGET // we don't need this on a target with low memory
#define NUMBER_TO_STRING_CACHE_SIZE 1024
#define NUMBER_TO_STRING_RE_CACHE_LIMIT 1024
#define NUMBER_TO_STRING_RE_CACHE_REASON_LIMIT 48
        if (this->Cache()->integerStringMap == nullptr)
        {
            this->Cache()->integerStringMap = RecyclerNew(GetRecycler(), StringMap, GetRecycler());
        }
        StringMap * integerStringMap = this->Cache()->integerStringMap;
        if (!integerStringMap->TryGetValue(value, &string))
        {
            // Add the string to hash table cache
            // limit the htable size to NUMBER_TO_STRING_CACHE_SIZE and refresh the cache often
            // however don't re-cache if we didn't use it much! App may not be suitable for caching.
            // 4% -> NUMBER_TO_STRING_RE_CACHE_REASON_LIMIT is equal to perf loss while we cache the stuff
            if (integerStringMapCacheMissCount > NUMBER_TO_STRING_RE_CACHE_LIMIT)
            {
                integerStringMapCacheMissCount = 0;
                if (integerStringMapCacheUseCount >= NUMBER_TO_STRING_RE_CACHE_REASON_LIMIT)
                {
                    integerStringMap->Clear();
                }
                integerStringMapCacheUseCount = 0;
            }

            if (integerStringMap->Count() > NUMBER_TO_STRING_CACHE_SIZE)
            {
#endif
                // Use recycler memory
                string = TaggedInt::ToString(value, this);
#ifndef CC_LOW_MEMORY_TARGET
                integerStringMapCacheMissCount++;
            }
            else
            {
                char16 stringBuffer[22];

                int pos = TaggedInt::ToBuffer(value, stringBuffer, _countof(stringBuffer));
                string = JavascriptString::NewCopyBuffer(stringBuffer + pos, (_countof(stringBuffer) - 1) - pos, this);
                integerStringMap->AddNew(value, string);
            }
        }
        else if (integerStringMapCacheUseCount < NUMBER_TO_STRING_RE_CACHE_REASON_LIMIT)
        {
            integerStringMapCacheUseCount++;
        }
#endif

        return string;
    }